

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<long> __thiscall
anon_unknown.dwarf_d00101::MiniscriptDescriptor::MaxSatisfactionElems(MiniscriptDescriptor *this)

{
  long lVar1;
  undefined8 extraout_RDX;
  Node<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar2;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  optional<unsigned_int> *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined1 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  miniscript::Node<unsigned_int>::GetStackSize(in_RDI);
  std::optional<long>::optional<unsigned_int,_true>
            ((optional<long> *)in_RDI,in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_10;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_18;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatisfactionElems() const override {
        return m_node->GetStackSize();
    }